

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall ON_PolyCurve::IsClosed(ON_PolyCurve *this)

{
  ON_Curve *pOVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar4 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (iVar4 == 1) {
    pOVar1 = *(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
    if (pOVar1 != (ON_Curve *)0x0) {
      iVar4 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])();
      return SUB41(iVar4,0);
    }
  }
  else if ((1 < iVar4) && (bVar3 = ON_Curve::IsClosed(&this->super_ON_Curve), bVar3)) {
    iVar4 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
    iVar6 = 1;
    iVar2 = 1;
    if (1 < iVar4) {
      iVar6 = iVar4;
    }
    do {
      iVar5 = iVar2;
      if (iVar6 == iVar5) break;
      bVar3 = HasGapAt(this,iVar5 + -1);
      iVar2 = iVar5 + 1;
    } while (!bVar3);
    return iVar4 <= iVar5;
  }
  return false;
}

Assistant:

bool 
ON_PolyCurve::IsClosed() const
{
  bool bIsClosed = false;
  const int count = Count();
  if ( count == 1 ) {
    // evaluation test required
    const ON_Curve* c = FirstSegmentCurve();
    if ( c )
      bIsClosed = c->IsClosed();
  }
  else if ( count > 1 ) 
  {
    // 17 May2005 Dale Lear 
    //  I added the FindNextGap(0) <= 0 test to
    //  prevent discontinuous curves from being
    //  classified as closed.
    bIsClosed = ( ON_Curve::IsClosed() && FindNextGap(0) <= 0 );
  }
  return bIsClosed;
}